

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.h
# Opt level: O0

void __thiscall jrtplib::RTPPacket::~RTPPacket(RTPPacket *this)

{
  uint8_t *buf;
  RTPMemoryManager *mgr;
  RTPPacket *this_local;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_00193b40;
  if ((this->packet != (uint8_t *)0x0) && ((this->externalbuffer & 1U) == 0)) {
    buf = this->packet;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDeleteByteArray(buf,mgr);
  }
  RTPMemoryObject::~RTPMemoryObject(&this->super_RTPMemoryObject);
  return;
}

Assistant:

virtual ~RTPPacket()																{ if (packet && !externalbuffer) RTPDeleteByteArray(packet,GetMemoryManager());  }